

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETime.cpp
# Opt level: O2

void __thiscall
CETime::CETime(CETime *this,vector<double,_std::allocator<double>_> *time,CETimeType time_format)

{
  value_type vVar1;
  size_type sVar2;
  reference pvVar3;
  size_t i;
  ulong __n;
  
  this->_vptr_CETime = (_func_int **)&PTR__CETime_00140d28;
  std::vector<double,_std::allocator<double>_>::vector(&this->time_);
  init_members(this);
  this->time_type_ = time_format;
  __n = 0;
  do {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(time);
    if (sVar2 <= __n) {
      return;
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](time,__n);
    vVar1 = *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->time_,__n);
    *pvVar3 = vVar1;
    __n = __n + 1;
  } while (__n != 4);
  return;
}

Assistant:

CETime::CETime(std::vector<double> time, CETimeType time_format)
{
    init_members();
    time_type_ = time_format;
    // Just in case the passed "time" variable isnt the same length
    for (size_t i=0; i<time.size(); i++) {
        time_[i] = time[i] ;
        // In case "time" has more than 4 elements,
        // quit when we've stored the first 4
        if (i==3) break ;
    }
}